

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o2.cc
# Opt level: O0

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::QuadO2::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,QuadO2 *this,RefinementPattern *ref_pat,dim_t codim)

{
  RefElType RVar1;
  RefElType RVar2;
  size_type sVar3;
  uint uVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  size_type sVar7;
  PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *pPVar8;
  Index IVar9;
  ulong uVar10;
  DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *this_00;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar11;
  string local_1cb8;
  allocator<char> local_1c91;
  string local_1c90;
  allocator<char> local_1c69;
  string local_1c68;
  stringstream local_1c48 [8];
  stringstream ss_6;
  ostream local_1c38 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_1ac0;
  undefined1 local_1aa8 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_1aa0;
  Matrix<double,__1,__1,_0,__1,__1> local_1a98;
  undefined1 local_1a80 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_1a78;
  double local_1a70;
  ConstColXpr local_1a68;
  ConstColXpr local_1a30;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_19f8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1980;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_18e0;
  int local_18bc;
  Index local_18b8;
  undefined1 local_18b0 [8];
  MatrixXd locChildCoords_2;
  allocator<char> local_1871;
  string local_1870;
  allocator<char> local_1849;
  string local_1848;
  stringstream local_1828 [8];
  stringstream ss_5;
  ostream local_1818 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_16a0;
  undefined1 local_1688 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_1680;
  double local_1678;
  ConstColXpr local_1670;
  ConstColXpr local_1638;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_1600;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1588;
  double local_14e8;
  ConstColXpr local_14e0;
  ConstColXpr local_14a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_1470;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_13f8;
  double local_1358;
  ConstColXpr local_1350;
  ConstColXpr local_1318;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_12e0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1268;
  double local_11c8;
  ConstColXpr local_11c0;
  ConstColXpr local_1188;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_1150;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_10d8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1038;
  int local_1014;
  Index local_1010;
  undefined1 local_1008 [8];
  MatrixXd locChildCoords_1;
  undefined1 local_fd8 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_fd0;
  double local_fc8;
  ConstColXpr local_fc0;
  ConstColXpr local_f88;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_f50;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_ed8;
  double local_e38;
  ConstColXpr local_e30;
  ConstColXpr local_df8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_dc0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_d48;
  double local_ca8;
  ConstColXpr local_ca0;
  ConstColXpr local_c68;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_c30;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_bb8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_b18;
  int local_af4;
  Index local_af0;
  undefined1 local_ae8 [8];
  MatrixXd locChildCoords;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_ac0;
  undefined1 local_a88 [8];
  MatrixXd locChildPolygonCoords;
  allocator<char> local_a49;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  stringstream local_a00 [8];
  stringstream ss_4;
  ostream local_9f0 [376];
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  stringstream local_808 [8];
  stringstream ss_3;
  ostream local_7f8 [376];
  ulong local_680;
  size_t child;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  stringstream local_608 [8];
  stringstream ss_2;
  ostream local_5f8 [380];
  uint local_47c;
  undefined1 local_478 [4];
  size_type noChildren;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  childPolygons;
  double local_458;
  double hLattice;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  stringstream local_3e0 [8];
  stringstream ss_1;
  ostream local_3d0 [376];
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  RefEl local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [378];
  RefEl local_26;
  RefEl local_25;
  dim_t local_24;
  RefinementPattern *pRStack_20;
  dim_t codim_local;
  RefinementPattern *ref_pat_local;
  QuadO2 *this_local;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *childGeoPtrs;
  
  local_24 = codim;
  pRStack_20 = ref_pat;
  ref_pat_local = (RefinementPattern *)this;
  this_local = (QuadO2 *)__return_storage_ptr__;
  local_25 = RefinementPattern::RefEl(ref_pat);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_25);
  local_26 = lf::base::RefEl::kQuad();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_26);
  if (RVar1 != RVar2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar5 = std::operator<<(local_1a0,"Refinement pattern for ");
    local_1e1 = RefinementPattern::RefEl(pRStack_20);
    lf::base::RefEl::ToString_abi_cxx11_(&local_1e0,&local_1e1);
    std::operator<<(poVar5,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"ref_pat.RefEl() == lf::base::RefEl::kQuad()",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
               ,&local_231);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_208,&local_230,0xbb,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"this code should not be reached");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_24 < 3) {
    sVar3 = RefinementPattern::LatticeConst(pRStack_20);
    local_458 = 1.0 / (double)sVar3;
    childPolygons.
    super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    ::vector(__return_storage_ptr__);
    (*pRStack_20->_vptr_RefinementPattern[1])(local_478,pRStack_20,(ulong)local_24);
    sVar7 = std::
            vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
            ::size((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                    *)local_478);
    local_47c = (uint)sVar7;
    uVar4 = (**pRStack_20->_vptr_RefinementPattern)(pRStack_20,(ulong)local_24);
    if ((uint)sVar7 != uVar4) {
      std::__cxx11::stringstream::stringstream(local_608);
      poVar5 = std::operator<<(local_5f8,"NumChildren ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_47c);
      poVar5 = std::operator<<(poVar5," <-> ");
      uVar4 = (**pRStack_20->_vptr_RefinementPattern)(pRStack_20,(ulong)local_24);
      std::ostream::operator<<(poVar5,uVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_628,"noChildren == ref_pat.NumChildren(codim)",&local_629);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                 ,&local_651);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_628,&local_650,200,(string *)&child);
      std::__cxx11::string::~string((string *)&child);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      std::__cxx11::string::~string((string *)&local_628);
      std::allocator<char>::~allocator(&local_629);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"this code should not be reached");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_680 = 0;
    while( true ) {
      if (local_47c <= local_680) {
        childPolygons.
        super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        std::
        vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                   *)local_478);
        if ((childPolygons.
             super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          std::
          vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          ::~vector(__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
      pPVar8 = &std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)local_478,local_680)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
      IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar8);
      if (IVar9 != 2) break;
      pPVar8 = &std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)local_478,local_680)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
      uVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar8);
      if (uVar10 != 3 - local_24) {
        pPVar8 = &std::
                  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                  ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                *)local_478,local_680)->
                  super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar8);
        if (IVar9 != 4) {
          std::__cxx11::stringstream::stringstream(local_a00);
          poVar5 = std::operator<<(local_9f0,"childPolygons[child].cols() = ");
          pPVar8 = &std::
                    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                    ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                  *)local_478,local_680)->
                    super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
          IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar8);
          std::ostream::operator<<(poVar5,IVar9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a20,
                     "(childPolygons[child].cols() == (3 - codim)) || (childPolygons[child].cols() == 4)"
                     ,&local_a21);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a48,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                     ,&local_a49);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed
                    (&local_a20,&local_a48,0xd6,
                     (string *)
                     &locChildPolygonCoords.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols);
          std::__cxx11::string::~string
                    ((string *)
                     &locChildPolygonCoords.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols);
          std::__cxx11::string::~string((string *)&local_a48);
          std::allocator<char>::~allocator(&local_a49);
          std::__cxx11::string::~string((string *)&local_a20);
          std::allocator<char>::~allocator(&local_a21);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"this code should not be reached");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      this_00 = (DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)
                std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)local_478,local_680);
      Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>
                ((Type *)&locChildCoords.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols,this_00);
      Eigen::operator*(&local_ac0,&local_458,
                       (StorageBaseType *)
                       &locChildCoords.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_a88,&local_ac0);
      if (local_24 == 0) {
        pPVar8 = &std::
                  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                  ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                *)local_478,local_680)->
                  super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar8);
        if (IVar9 == 3) {
          local_af0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 local_a88);
          local_af4 = 6;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                    ((Matrix<double,_1,_1,0,_1,_1> *)local_ae8,&local_af0,&local_af4);
          Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                    (&local_b18,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_ae8,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_c68,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,0)
          ;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_ca0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,1)
          ;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
          operator+(&local_c30,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                    &local_c68,
                    (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_ca0);
          local_ca8 = 2.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator/(&local_bb8,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_c30,&local_ca8);
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b18,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                *)&local_bb8);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_df8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,1)
          ;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_e30,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,2)
          ;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
          operator+(&local_dc0,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                    &local_df8,
                    (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_e30);
          local_e38 = 2.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator/(&local_d48,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_dc0,&local_e38);
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                *)&local_d48);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_f88,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,2)
          ;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_fc0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,0)
          ;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
          operator+(&local_f50,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                    &local_f88,
                    (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_fc0);
          local_fc8 = 2.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator/(&local_ed8,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_f50,&local_fc8);
          Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&local_ed8);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                    (&local_b18);
          (*(this->super_Geometry)._vptr_Geometry[3])
                    (&locChildCoords_1.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,this,local_ae8);
          std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_fd8);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::TriaO2,std::default_delete<lf::geometry::TriaO2>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_fd0,
                     (unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_> *
                     )local_fd8);
          std::
          vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&local_fd0);
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_fd0);
          std::unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>::
          ~unique_ptr((unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>
                       *)local_fd8);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)
                     &locChildCoords_1.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_ae8);
        }
        else {
          pPVar8 = &std::
                    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                    ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                  *)local_478,local_680)->
                    super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
          IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar8);
          if (IVar9 != 4) {
            std::__cxx11::stringstream::stringstream(local_1828);
            poVar5 = std::operator<<(local_1818,"childPolygons[");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_680);
            poVar5 = std::operator<<(poVar5,"].cols() = ");
            pPVar8 = &std::
                      vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                      ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                    *)local_478,local_680)->
                      super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
            IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar8);
            std::ostream::operator<<(poVar5,IVar9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1848,"false",&local_1849);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1870,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                       ,&local_1871);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed
                      (&local_1848,&local_1870,0xfb,
                       (string *)
                       &locChildCoords_2.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            std::__cxx11::string::~string
                      ((string *)
                       &locChildCoords_2.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            std::__cxx11::string::~string((string *)&local_1870);
            std::allocator<char>::~allocator(&local_1871);
            std::__cxx11::string::~string((string *)&local_1848);
            std::allocator<char>::~allocator(&local_1849);
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"this code should not be reached");
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_1010 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                                 ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  local_a88);
          local_1014 = 8;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                    ((Matrix<double,_1,_1,0,_1,_1> *)local_1008,&local_1010,&local_1014);
          Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                    (&local_1038,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1008,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_1188,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,0
                    );
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_11c0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,1
                    );
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
          operator+(&local_1150,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                    &local_1188,
                    (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_11c0);
          local_11c8 = 2.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator/(&local_10d8,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_1150,&local_11c8);
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1038,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                *)&local_10d8);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_1318,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,1
                    );
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_1350,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,2
                    );
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
          operator+(&local_12e0,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                    &local_1318,
                    (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_1350);
          local_1358 = 2.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator/(&local_1268,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_12e0,&local_1358);
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                *)&local_1268);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_14a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,2
                    );
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_14e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,3
                    );
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
          operator+(&local_1470,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                    &local_14a8,
                    (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_14e0);
          local_14e8 = 2.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator/(&local_13f8,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_1470,&local_14e8);
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                *)&local_13f8);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_1638,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,3
                    );
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_1670,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,0
                    );
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
          operator+(&local_1600,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                    &local_1638,
                    (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)&local_1670);
          local_1678 = 2.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
          ::operator/(&local_1588,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                       *)&local_1600,&local_1678);
          Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&local_1588);
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                    (&local_1038);
          (*(this->super_Geometry)._vptr_Geometry[3])(&local_16a0,this,local_1008);
          std::make_unique<lf::geometry::QuadO2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_1688);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::QuadO2,std::default_delete<lf::geometry::QuadO2>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_1680,
                     (unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_> *
                     )local_1688);
          std::
          vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&local_1680);
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_1680);
          std::unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>::
          ~unique_ptr((unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>
                       *)local_1688);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_16a0);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_1008);
        }
      }
      else if (local_24 == 1) {
        local_18b8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                               ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                local_a88);
        local_18bc = 3;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_18b0,&local_18b8,&local_18bc);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                  (&local_18e0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_18b0,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (&local_1a30,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,0);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (&local_1a68,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a88,1);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::
        operator+(&local_19f8,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                  &local_1a30,
                  (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                   *)&local_1a68);
        local_1a70 = 2.0;
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>
        ::operator/(&local_1980,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                     *)&local_19f8,&local_1a70);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_18e0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_1980);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                  (&local_18e0);
        (*(this->super_Geometry)._vptr_Geometry[3])(&local_1a98,this,local_18b0);
        std::make_unique<lf::geometry::SegmentO2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_1a80);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::SegmentO2,std::default_delete<lf::geometry::SegmentO2>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_1a78,
                   (unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                    *)local_1a80);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_1a78);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_1a78);
        std::unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>::
        ~unique_ptr((unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                     *)local_1a80);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1a98);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_18b0);
      }
      else {
        if (local_24 != 2) {
          std::__cxx11::stringstream::stringstream(local_1c48);
          std::operator<<(local_1c38,"Illegal co-dimension");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c68,"false",&local_1c69);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c90,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                     ,&local_1c91);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_1c68,&local_1c90,0x111,&local_1cb8);
          std::__cxx11::string::~string((string *)&local_1cb8);
          std::__cxx11::string::~string((string *)&local_1c90);
          std::allocator<char>::~allocator(&local_1c91);
          std::__cxx11::string::~string((string *)&local_1c68);
          std::allocator<char>::~allocator(&local_1c69);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"this code should not be reached");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        (*(this->super_Geometry)._vptr_Geometry[3])(&local_1ac0,this,local_a88);
        std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_1aa8);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_1aa0,
                   (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                   local_1aa8);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_1aa0);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_1aa0);
        std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
                  ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                   local_1aa8);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1ac0);
      }
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_a88);
      local_680 = local_680 + 1;
    }
    std::__cxx11::stringstream::stringstream(local_808);
    poVar5 = std::operator<<(local_7f8,"childPolygons[child].rows() = ");
    pPVar8 = &std::
              vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            *)local_478,local_680)->
              super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
    IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar8);
    std::ostream::operator<<(poVar5,IVar9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"childPolygons[child].rows() == 2",&local_829);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
               ,&local_851);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_828,&local_850,0xd2,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator(&local_851);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"this code should not be reached");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_3e0);
  poVar5 = std::operator<<(local_3d0,"Illegal codim ");
  std::ostream::operator<<(poVar5,local_24);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"codim < 3",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
             ,&local_429);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_400,&local_428,0xbc,(string *)&hLattice);
  std::__cxx11::string::~string((string *)&hLattice);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"this code should not be reached");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::unique_ptr<Geometry>> QuadO2::ChildGeometry(
    const RefinementPattern& ref_pat, lf::base::dim_t codim) const {
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kQuad(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);

  const double hLattice = 1. / static_cast<double>(ref_pat.LatticeConst());
  std::vector<std::unique_ptr<Geometry>> childGeoPtrs = {};

  // get coordinates of childGeometries
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>> childPolygons(
      ref_pat.ChildPolygons(codim));

  const base::size_type noChildren = childPolygons.size();
  LF_VERIFY_MSG(
      noChildren == ref_pat.NumChildren(codim),
      "NumChildren " << noChildren << " <-> " << ref_pat.NumChildren(codim));

  // create a geometry object for each child
  for (size_t child = 0; child < noChildren; ++child) {
    // codim == 0: a child triangle/quadrilateral is described by a lattice
    // polygon with six/eight vertices
    // codim == 1: a child segment is described by a polygon with three vertices
    // codim == 2: a child point by a single point ("polygon with one corner")
    LF_VERIFY_MSG(
        childPolygons[child].rows() == 2,
        "childPolygons[child].rows() = " << childPolygons[child].rows());
    LF_VERIFY_MSG(
        (childPolygons[child].cols() == (3 - codim)) ||
            (childPolygons[child].cols() == 4),
        "childPolygons[child].cols() = " << childPolygons[child].cols());

    const Eigen::MatrixXd locChildPolygonCoords(
        hLattice * childPolygons[child].cast<double>());

    switch (codim) {
      case 0: {
        if (childPolygons[child].cols() == 3) {
          Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 6);
          locChildCoords << locChildPolygonCoords,
              (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) /
                  2.,
              (locChildPolygonCoords.col(1) + locChildPolygonCoords.col(2)) /
                  2.,
              (locChildPolygonCoords.col(2) + locChildPolygonCoords.col(0)) /
                  2.;

          childGeoPtrs.push_back(
              std::make_unique<TriaO2>(Global(locChildCoords)));

        } else if (childPolygons[child].cols() == 4) {
          Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 8);
          locChildCoords << locChildPolygonCoords,
              (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) /
                  2.,
              (locChildPolygonCoords.col(1) + locChildPolygonCoords.col(2)) /
                  2.,
              (locChildPolygonCoords.col(2) + locChildPolygonCoords.col(3)) /
                  2.,
              (locChildPolygonCoords.col(3) + locChildPolygonCoords.col(0)) /
                  2.;

          childGeoPtrs.push_back(
              std::make_unique<QuadO2>(Global(locChildCoords)));

        } else {
          LF_VERIFY_MSG(false, "childPolygons[" << child << "].cols() = "
                                                << childPolygons[child].cols());
        }

        break;
      }
      case 1: {
        Eigen::MatrixXd locChildCoords(locChildPolygonCoords.rows(), 3);
        locChildCoords << locChildPolygonCoords,
            (locChildPolygonCoords.col(0) + locChildPolygonCoords.col(1)) / 2.;

        childGeoPtrs.push_back(
            std::make_unique<SegmentO2>(Global(locChildCoords)));

        break;
      }
      case 2: {
        childGeoPtrs.push_back(
            std::make_unique<Point>(Global(locChildPolygonCoords)));

        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
      }
    }
  }

  return childGeoPtrs;
}